

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

void cmSystemTools::FindCMakeResources(char *argv0)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  char *pcVar4;
  string_view str;
  bool local_dd4;
  byte local_daa;
  cmAlphaNum local_cc0;
  cmAlphaNum local_c90;
  string local_c60;
  byte local_c39;
  cmAlphaNum local_c38;
  cmAlphaNum local_c08;
  string local_bd8;
  long local_bb8;
  ifstream fin2;
  cmAlphaNum local_9b0;
  cmAlphaNum local_980;
  string local_950;
  string local_930;
  undefined1 local_910 [8];
  string src_dir;
  ifstream fin;
  cmAlphaNum local_6e8;
  cmAlphaNum local_6b8;
  undefined1 local_688 [8];
  string src_dir_txt;
  string dir;
  cmAlphaNum local_640;
  cmAlphaNum local_610;
  string local_5e0;
  cmAlphaNum local_5c0;
  cmAlphaNum local_590;
  string local_560;
  cmAlphaNum local_540;
  cmAlphaNum local_510;
  string local_4e0;
  cmAlphaNum local_4c0;
  cmAlphaNum local_490;
  string local_460;
  undefined1 local_440 [8];
  string prefix;
  char *local_410;
  cmAlphaNum local_408;
  cmAlphaNum local_3d8;
  string local_3a8;
  char *local_388;
  cmAlphaNum local_380;
  cmAlphaNum local_350;
  string local_320;
  char *local_300;
  cmAlphaNum local_2f8;
  cmAlphaNum local_2c8;
  string local_298;
  char *local_278;
  cmAlphaNum local_270;
  cmAlphaNum local_240;
  string local_210;
  char *local_1f0;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b8;
  string local_188;
  char *local_168;
  cmAlphaNum local_160;
  cmAlphaNum local_130;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  undefined1 local_70 [8];
  string exe;
  string errorMsg;
  string exe_dir;
  char *argv0_local;
  
  std::__cxx11::string::string((string *)(errorMsg.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(exe.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_70);
  bVar1 = cmsys::SystemTools::FindProgramPath
                    (argv0,(string *)local_70,(string *)(exe.field_2._M_local_buf + 8),(char *)0x0,
                     (char *)0x0,(char *)0x0);
  if (bVar1) {
    cmsys::SystemTools::GetRealPath(&local_a0,(string *)local_70,(string *)0x0);
    std::__cxx11::string::operator=((string *)local_70,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    cmsys::SystemTools::GetFilenamePath(&local_c0,(string *)local_70);
    std::__cxx11::string::operator=
              ((string *)(errorMsg.field_2._M_local_buf + 8),(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
  }
  cmsys::SystemTools::GetActualCaseForPath(&local_e0,(string *)((long)&errorMsg.field_2 + 8));
  std::__cxx11::string::operator=((string *)(errorMsg.field_2._M_local_buf + 8),(string *)&local_e0)
  ;
  std::__cxx11::string::~string((string *)&local_e0);
  cmAlphaNum::cmAlphaNum(&local_130,(string *)(errorMsg.field_2._M_local_buf + 8));
  cmAlphaNum::cmAlphaNum(&local_160,"/cmake");
  local_168 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&local_100,&local_130,&local_160,&local_168);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCommand_abi_cxx11_,(string *)&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  cmAlphaNum::cmAlphaNum(&local_1b8,(string *)((long)&errorMsg.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_1e8,"/ctest");
  local_1f0 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&local_188,&local_1b8,&local_1e8,&local_1f0);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCTestCommand_abi_cxx11_,(string *)&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  cmAlphaNum::cmAlphaNum(&local_240,(string *)((long)&errorMsg.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_270,"/cpack");
  local_278 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&local_210,&local_240,&local_270,&local_278);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCPackCommand_abi_cxx11_,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  cmAlphaNum::cmAlphaNum(&local_2c8,(string *)((long)&errorMsg.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_2f8,"/cmake-gui");
  local_300 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&local_298,&local_2c8,&local_2f8,&local_300);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeGUICommand_abi_cxx11_,(string *)&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeGUICommand_abi_cxx11_);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  cmAlphaNum::cmAlphaNum(&local_350,(string *)((long)&errorMsg.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_380,"/ccmake");
  local_388 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&local_320,&local_350,&local_380,&local_388);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMakeCursesCommand_abi_cxx11_,(string *)&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMakeCursesCommand_abi_cxx11_);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  cmAlphaNum::cmAlphaNum(&local_3d8,(string *)((long)&errorMsg.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_408,"/cmcldeps");
  local_410 = cmsys::SystemTools::GetExecutableExtension();
  cmStrCat<char_const*>(&local_3a8,&local_3d8,&local_408,&local_410);
  std::__cxx11::string::operator=
            ((string *)&cmSystemToolsCMClDepsCommand_abi_cxx11_,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  bVar1 = cmsys::SystemTools::FileExists(&cmSystemToolsCMClDepsCommand_abi_cxx11_);
  if (!bVar1) {
    std::__cxx11::string::clear();
  }
  str = (string_view)
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((string *)(errorMsg.field_2._M_local_buf + 8));
  prefix.field_2._8_8_ = str._M_len;
  bVar1 = cmHasLiteralSuffix<5ul>(str,(char (*) [5])0xd50b9e);
  if (bVar1) {
    std::__cxx11::string::size();
    cmStrLen<5ul>((char (*) [5])0xd50b9e);
    std::__cxx11::string::substr((ulong)local_440,(ulong)((long)&errorMsg.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_490,(string *)local_440);
    cmAlphaNum::cmAlphaNum(&local_4c0,"/share/cmake-3.25");
    cmStrCat<>(&local_460,&local_490,&local_4c0);
    std::__cxx11::string::operator=
              ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    cmAlphaNum::cmAlphaNum(&local_510,(string *)local_440);
    cmAlphaNum::cmAlphaNum(&local_540,"/doc/cmake-3.25/html/index.html");
    cmStrCat<>(&local_4e0,&local_510,&local_540);
    bVar1 = cmsys::SystemTools::FileExists(&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    if (bVar1) {
      cmAlphaNum::cmAlphaNum(&local_590,(string *)local_440);
      cmAlphaNum::cmAlphaNum(&local_5c0,"/doc/cmake-3.25/html");
      cmStrCat<>(&local_560,&local_590,&local_5c0);
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&local_560);
      std::__cxx11::string::~string((string *)&local_560);
    }
    std::__cxx11::string::~string((string *)local_440);
  }
  bVar2 = std::__cxx11::string::empty();
  local_daa = 1;
  if ((bVar2 & 1) == 0) {
    cmAlphaNum::cmAlphaNum(&local_610,&cmSystemToolsCMakeRoot_abi_cxx11_);
    cmAlphaNum::cmAlphaNum(&local_640,"/Modules/CMake.cmake");
    cmStrCat<>(&local_5e0,&local_610,&local_640);
    bVar1 = cmsys::SystemTools::FileExists(&local_5e0);
    local_daa = bVar1 ^ 0xff;
    std::__cxx11::string::~string((string *)&local_5e0);
  }
  if ((local_daa & 1) != 0) {
    cmsys::SystemTools::GetFilenamePath
              ((string *)((long)&src_dir_txt.field_2 + 8),(string *)((long)&errorMsg.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_6b8,(string *)((long)&src_dir_txt.field_2 + 8));
    cmAlphaNum::cmAlphaNum(&local_6e8,"/CMakeFiles/CMakeSourceDir.txt");
    cmStrCat<>((string *)local_688,&local_6b8,&local_6e8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream((void *)((long)&src_dir.field_2 + 8),pcVar4,_S_in);
    std::__cxx11::string::string((string *)local_910);
    bVar1 = std::ios::operator_cast_to_bool
                      ((ios *)((long)&src_dir.field_2 + *(long *)(src_dir.field_2._8_8_ + -0x18) + 8
                              ));
    if (((bVar1) &&
        (bVar1 = cmsys::SystemTools::GetLineFromStream
                           ((istream *)(src_dir.field_2._M_local_buf + 8),(string *)local_910,
                            (bool *)0x0,0xffffffffffffffff), bVar1)) &&
       (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_910), bVar1)) {
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)local_910);
    }
    else {
      cmsys::SystemTools::GetFilenamePath(&local_930,(string *)((long)&src_dir_txt.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(src_dir_txt.field_2._M_local_buf + 8),(string *)&local_930);
      std::__cxx11::string::~string((string *)&local_930);
      cmAlphaNum::cmAlphaNum(&local_980,(string *)(src_dir_txt.field_2._M_local_buf + 8));
      cmAlphaNum::cmAlphaNum(&local_9b0,"/CMakeFiles/CMakeSourceDir.txt");
      cmStrCat<>(&local_950,&local_980,&local_9b0);
      std::__cxx11::string::operator=((string *)local_688,(string *)&local_950);
      std::__cxx11::string::~string((string *)&local_950);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_bb8,pcVar4,_S_in);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&local_bb8 + *(long *)(local_bb8 + -0x18)));
      if (((bVar1) &&
          (bVar1 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_bb8,(string *)local_910,(bool *)0x0,
                              0xffffffffffffffff), bVar1)) &&
         (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_910), bVar1)) {
        std::__cxx11::string::operator=
                  ((string *)&cmSystemToolsCMakeRoot_abi_cxx11_,(string *)local_910);
      }
      std::ifstream::~ifstream(&local_bb8);
    }
    uVar3 = std::__cxx11::string::empty();
    local_c39 = 0;
    local_dd4 = false;
    if ((uVar3 & 1) == 0) {
      uVar3 = std::__cxx11::string::empty();
      local_dd4 = false;
      if ((uVar3 & 1) != 0) {
        cmAlphaNum::cmAlphaNum(&local_c08,(string *)((long)&src_dir_txt.field_2 + 8));
        cmAlphaNum::cmAlphaNum(&local_c38,"/Utilities/Sphinx/html/index.html");
        cmStrCat<>(&local_bd8,&local_c08,&local_c38);
        local_c39 = 1;
        local_dd4 = cmsys::SystemTools::FileExists(&local_bd8);
      }
    }
    if ((local_c39 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_bd8);
    }
    if (local_dd4 != false) {
      cmAlphaNum::cmAlphaNum(&local_c90,(string *)((long)&src_dir_txt.field_2 + 8));
      cmAlphaNum::cmAlphaNum(&local_cc0,"/Utilities/Sphinx/html");
      cmStrCat<>(&local_c60,&local_c90,&local_cc0);
      std::__cxx11::string::operator=
                ((string *)&cmSystemToolsHTMLDoc_abi_cxx11_,(string *)&local_c60);
      std::__cxx11::string::~string((string *)&local_c60);
    }
    std::__cxx11::string::~string((string *)local_910);
    std::ifstream::~ifstream((void *)((long)&src_dir.field_2 + 8));
    std::__cxx11::string::~string((string *)local_688);
    std::__cxx11::string::~string((string *)(src_dir_txt.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(exe.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(errorMsg.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmSystemTools::FindCMakeResources(const char* argv0)
{
  std::string exe_dir;
#if defined(_WIN32) && !defined(__CYGWIN__)
  (void)argv0; // ignore this on windows
  wchar_t modulepath[_MAX_PATH];
  ::GetModuleFileNameW(NULL, modulepath, sizeof(modulepath));
  std::string path = cmsys::Encoding::ToNarrow(modulepath);
  std::string realPath =
    cmSystemTools::GetRealPathResolvingWindowsSubst(path, NULL);
  if (realPath.empty()) {
    realPath = path;
  }
  exe_dir = cmSystemTools::GetFilenamePath(realPath);
#elif defined(__APPLE__)
  (void)argv0; // ignore this on OS X
#  define CM_EXE_PATH_LOCAL_SIZE 16384
  char exe_path_local[CM_EXE_PATH_LOCAL_SIZE];
#  if defined(MAC_OS_X_VERSION_10_3) && !defined(MAC_OS_X_VERSION_10_4)
  unsigned long exe_path_size = CM_EXE_PATH_LOCAL_SIZE;
#  else
  uint32_t exe_path_size = CM_EXE_PATH_LOCAL_SIZE;
#  endif
#  undef CM_EXE_PATH_LOCAL_SIZE
  char* exe_path = exe_path_local;
  if (_NSGetExecutablePath(exe_path, &exe_path_size) < 0) {
    exe_path = static_cast<char*>(malloc(exe_path_size));
    _NSGetExecutablePath(exe_path, &exe_path_size);
  }
  exe_dir =
    cmSystemTools::GetFilenamePath(cmSystemTools::GetRealPath(exe_path));
  if (exe_path != exe_path_local) {
    free(exe_path);
  }
  if (cmSystemTools::GetFilenameName(exe_dir) == "MacOS") {
    // The executable is inside an application bundle.
    // Look for ..<CMAKE_BIN_DIR> (install tree) and then fall back to
    // ../../../bin (build tree).
    exe_dir = cmSystemTools::GetFilenamePath(exe_dir);
    if (cmSystemTools::FileExists(exe_dir + CMAKE_BIN_DIR "/cmake")) {
      exe_dir += CMAKE_BIN_DIR;
    } else {
      exe_dir = cmSystemTools::GetFilenamePath(exe_dir);
      exe_dir = cmSystemTools::GetFilenamePath(exe_dir);
    }
  }
#else
  std::string errorMsg;
  std::string exe;
  if (cmSystemTools::FindProgramPath(argv0, exe, errorMsg)) {
    // remove symlinks
    exe = cmSystemTools::GetRealPath(exe);
    exe_dir = cmSystemTools::GetFilenamePath(exe);
  } else {
    // ???
  }
#endif
  exe_dir = cmSystemTools::GetActualCaseForPath(exe_dir);
  cmSystemToolsCMakeCommand =
    cmStrCat(exe_dir, "/cmake", cmSystemTools::GetExecutableExtension());
#ifdef CMAKE_BOOTSTRAP
  // The bootstrap cmake does not provide the other tools,
  // so use the directory where they are about to be built.
  exe_dir = CMAKE_BOOTSTRAP_BINARY_DIR "/bin";
#endif
  cmSystemToolsCTestCommand =
    cmStrCat(exe_dir, "/ctest", cmSystemTools::GetExecutableExtension());
  cmSystemToolsCPackCommand =
    cmStrCat(exe_dir, "/cpack", cmSystemTools::GetExecutableExtension());
  cmSystemToolsCMakeGUICommand =
    cmStrCat(exe_dir, "/cmake-gui", cmSystemTools::GetExecutableExtension());
  if (!cmSystemTools::FileExists(cmSystemToolsCMakeGUICommand)) {
    cmSystemToolsCMakeGUICommand.clear();
  }
  cmSystemToolsCMakeCursesCommand =
    cmStrCat(exe_dir, "/ccmake", cmSystemTools::GetExecutableExtension());
  if (!cmSystemTools::FileExists(cmSystemToolsCMakeCursesCommand)) {
    cmSystemToolsCMakeCursesCommand.clear();
  }
  cmSystemToolsCMClDepsCommand =
    cmStrCat(exe_dir, "/cmcldeps", cmSystemTools::GetExecutableExtension());
  if (!cmSystemTools::FileExists(cmSystemToolsCMClDepsCommand)) {
    cmSystemToolsCMClDepsCommand.clear();
  }

#ifndef CMAKE_BOOTSTRAP
  // Install tree has
  // - "<prefix><CMAKE_BIN_DIR>/cmake"
  // - "<prefix><CMAKE_DATA_DIR>"
  // - "<prefix><CMAKE_DOC_DIR>"
  if (cmHasLiteralSuffix(exe_dir, CMAKE_BIN_DIR)) {
    std::string const prefix =
      exe_dir.substr(0, exe_dir.size() - cmStrLen(CMAKE_BIN_DIR));
    cmSystemToolsCMakeRoot = cmStrCat(prefix, CMAKE_DATA_DIR);
    if (cmSystemTools::FileExists(
          cmStrCat(prefix, CMAKE_DOC_DIR "/html/index.html"))) {
      cmSystemToolsHTMLDoc = cmStrCat(prefix, CMAKE_DOC_DIR "/html");
    }
  }
  if (cmSystemToolsCMakeRoot.empty() ||
      !cmSystemTools::FileExists(
        cmStrCat(cmSystemToolsCMakeRoot, "/Modules/CMake.cmake"))) {
    // Build tree has "<build>/bin[/<config>]/cmake" and
    // "<build>/CMakeFiles/CMakeSourceDir.txt".
    std::string dir = cmSystemTools::GetFilenamePath(exe_dir);
    std::string src_dir_txt = cmStrCat(dir, "/CMakeFiles/CMakeSourceDir.txt");
    cmsys::ifstream fin(src_dir_txt.c_str());
    std::string src_dir;
    if (fin && cmSystemTools::GetLineFromStream(fin, src_dir) &&
        cmSystemTools::FileIsDirectory(src_dir)) {
      cmSystemToolsCMakeRoot = src_dir;
    } else {
      dir = cmSystemTools::GetFilenamePath(dir);
      src_dir_txt = cmStrCat(dir, "/CMakeFiles/CMakeSourceDir.txt");
      cmsys::ifstream fin2(src_dir_txt.c_str());
      if (fin2 && cmSystemTools::GetLineFromStream(fin2, src_dir) &&
          cmSystemTools::FileIsDirectory(src_dir)) {
        cmSystemToolsCMakeRoot = src_dir;
      }
    }
    if (!cmSystemToolsCMakeRoot.empty() && cmSystemToolsHTMLDoc.empty() &&
        cmSystemTools::FileExists(
          cmStrCat(dir, "/Utilities/Sphinx/html/index.html"))) {
      cmSystemToolsHTMLDoc = cmStrCat(dir, "/Utilities/Sphinx/html");
    }
  }
#else
  // Bootstrap build knows its source.
  cmSystemToolsCMakeRoot = CMAKE_BOOTSTRAP_SOURCE_DIR;
#endif
}